

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testBindNoGen(LifeTest *this)

{
  CallLogWrapper *this_00;
  char cVar1;
  deUint32 dVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *msg;
  Name name;
  ResultCollector errors;
  Name local_40;
  ResultCollector local_30;
  
  local_30.m_testCtx = (this->super_TestBase).super_TestCase.super_TestNode.m_testCtx;
  local_30.m_log = (local_30.m_testCtx)->m_log;
  local_30.m_result = QP_TEST_RESULT_PASS;
  local_30.m_message = "Pass";
  dVar2 = deRandom_getUint32(&(this->super_TestBase).m_rnd.m_rnd);
  iVar3 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)dVar2);
  if ((char)iVar3 != '\0') {
    ResultCollector::fail(&local_30,"Randomly chosen identifier already exists");
    goto LAB_014b5d45;
  }
  local_40.m_type = this->m_type;
  local_40.m_name = dVar2;
  iVar3 = (*(local_40.m_type)->_vptr_Type[6])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar3),dVar2);
  iVar3 = (*this->m_type->_vptr_Type[6])();
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x20))
                    ((long *)CONCAT44(extraout_var_00,iVar3));
  this_00 = &(this->super_TestBase).super_CallLogWrapper;
  if (cVar1 == '\0') {
    GVar4 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar4 != 0) {
      ResultCollector::fail(&local_30,"Failed when binding a name not generated by Gen* call");
    }
    iVar3 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)local_40.m_name);
    if ((char)iVar3 == '\0') {
      msg = "Object was not created by the Bind* call";
      goto LAB_014b5d31;
    }
  }
  else {
    GVar4 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar4 != 0x502) {
      ResultCollector::fail(&local_30,"Did not fail when binding a name not generated by Gen* call")
      ;
    }
    iVar3 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)local_40.m_name);
    if ((char)iVar3 != '\0') {
      msg = "Bind* created an object for a name not generated by a Gen* call";
LAB_014b5d31:
      ResultCollector::fail(&local_30,msg);
    }
  }
  Name::~Name(&local_40);
LAB_014b5d45:
  ResultCollector::~ResultCollector(&local_30);
  return;
}

Assistant:

void LifeTest::testBindNoGen (void)
{
	ResultCollector	errors	(getTestContext());
	const GLuint	id		= m_rnd.getUint32();

	if (!errors.check(!m_type.exists(id), "Randomly chosen identifier already exists"))
		return;

	Name			name	(m_type, id);
	binder().bind(*name);

	if (binder().genRequired())
	{
		errors.check(glGetError() == GL_INVALID_OPERATION,
					 "Did not fail when binding a name not generated by Gen* call");
		errors.check(!m_type.exists(*name),
					 "Bind* created an object for a name not generated by a Gen* call");
	}
	else
	{
		errors.check(glGetError() == GL_NO_ERROR,
					 "Failed when binding a name not generated by Gen* call");
		errors.check(m_type.exists(*name),
					 "Object was not created by the Bind* call");
	}
}